

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencode.c
# Opt level: O3

block * gen_vlan_no_bpf_extensions(compiler_state_t *cstate,int vlan_num)

{
  u_int *puVar1;
  block *pbVar2;
  block *b1;
  block *b1_00;
  
  pbVar2 = gen_linktype(cstate,0x8100);
  b1 = gen_linktype(cstate,0x88a8);
  gen_or(pbVar2,b1);
  b1_00 = gen_linktype(cstate,0x9100);
  gen_or(b1,b1_00);
  pbVar2 = b1_00;
  if (-1 < vlan_num) {
    pbVar2 = gen_ncmp(cstate,OR_LINKPL,0,8,0xfff,0x10,0,vlan_num);
    gen_and(b1_00,pbVar2);
  }
  puVar1 = &(cstate->off_linkpl).constant_part;
  *puVar1 = *puVar1 + 4;
  puVar1 = &(cstate->off_linktype).constant_part;
  *puVar1 = *puVar1 + 4;
  return pbVar2;
}

Assistant:

static struct block *
gen_vlan_no_bpf_extensions(compiler_state_t *cstate, int vlan_num)
{
        struct block *b0, *b1;

        /* check for VLAN, including QinQ */
        b0 = gen_linktype(cstate, ETHERTYPE_8021Q);
        b1 = gen_linktype(cstate, ETHERTYPE_8021AD);
        gen_or(b0,b1);
        b0 = b1;
        b1 = gen_linktype(cstate, ETHERTYPE_8021QINQ);
        gen_or(b0,b1);
        b0 = b1;

        /* If a specific VLAN is requested, check VLAN id */
        if (vlan_num >= 0) {
                b1 = gen_mcmp(cstate, OR_LINKPL, 0, BPF_H,
                              (bpf_int32)vlan_num, 0x0fff);
                gen_and(b0, b1);
                b0 = b1;
        }

	/*
	 * The payload follows the full header, including the
	 * VLAN tags, so skip past this VLAN tag.
	 */
        cstate->off_linkpl.constant_part += 4;

	/*
	 * The link-layer type information follows the VLAN tags, so
	 * skip past this VLAN tag.
	 */
        cstate->off_linktype.constant_part += 4;

        return b0;
}